

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O0

void test_write<io::posix::file&>(file *file)

{
  undefined8 stream;
  bool bVar1;
  size_type sVar2;
  reference __ptr;
  ResultBuilder *this;
  char *extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> data;
  ExpressionLhs<const_std::basic_string_view<char,_std::char_traits<char>_>_&> EVar3;
  ExpressionLhs<const_std::basic_string_view<char,_std::char_traits<char>_>_&> local_618;
  SourceLineInfo local_608;
  undefined1 local_5e0 [8];
  ResultBuilder __catchResult_1;
  allocator<char> local_331;
  undefined1 local_330 [8];
  string read_buf;
  FILE *in_file;
  char *pcStack_300;
  const_buffer local_2f8 [2];
  SourceLineInfo local_2d8;
  undefined1 local_2b0 [8];
  ResultBuilder __catchResult;
  file *file_local;
  
  __catchResult._664_8_ = file;
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/test/file_test.cpp"
               ,0x22);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2b0,"REQUIRE_NOTHROW",&local_2d8,
               "io::write(file, io::buffer(test_file_contents))",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_2d8);
    stream = __catchResult._664_8_;
    in_file = (FILE *)test_file_contents._M_len;
    pcStack_300 = test_file_contents._M_str;
    data._M_str = extraout_RDX;
    data._M_len = (size_t)pcStack_300;
    local_2f8[0] = io::net::buffer<char,std::char_traits<char>>((net *)in_file,data);
    io::net::write<io::posix::file,io::net::const_buffer,void>((file *)stream,local_2f8);
    Catch::ResultBuilder::captureResult((ResultBuilder *)local_2b0,Ok);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2b0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2b0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2b0);
    bVar1 = Catch::alwaysFalse();
  } while (bVar1);
  read_buf.field_2._8_8_ = fopen("io_test_file.txt","rb");
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&test_file_contents);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_330,sVar2,'\0',&local_331);
  std::allocator<char>::~allocator(&local_331);
  __catchResult_1._664_8_ = std::__cxx11::string::begin();
  __ptr = __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&__catchResult_1.m_shouldDebugBreak);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&test_file_contents);
  fread(__ptr,1,sVar2,(FILE *)read_buf.field_2._8_8_);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_608,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/test/file_test.cpp"
               ,0x28);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5e0,"REQUIRE",&local_608,"test_file_contents == read_buf",
               Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_608);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_5e0,&test_file_contents);
    local_618 = EVar3;
    this = Catch::ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&>::
           operator==((ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&> *)
                      &local_618,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330
                     );
    Catch::ResultBuilder::endExpression(this);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5e0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5e0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5e0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  fclose((FILE *)read_buf.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_330);
  return;
}

Assistant:

void test_write(File&& file)
{
    REQUIRE_NOTHROW(io::write(file, io::buffer(test_file_contents)));

    FILE* in_file = std::fopen(test_file_name, "rb");
    std::string read_buf(test_file_contents.size(), '\0');
    std::fread(&*read_buf.begin(), 1, test_file_contents.size(), in_file);

    REQUIRE(test_file_contents == read_buf);

    std::fclose(in_file);
}